

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.cxx
# Opt level: O2

void __thiscall Fl_Scrollbar::increment_cb(Fl_Scrollbar *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = (this->super_Fl_Slider).super_Fl_Valuator.min;
  dVar1 = (this->super_Fl_Slider).super_Fl_Valuator.max;
  iVar2 = *(int *)&(this->super_Fl_Slider).field_0xac;
  iVar4 = -iVar2;
  iVar3 = iVar2;
  if (dVar1 < dVar6) {
    iVar3 = iVar4;
  }
  iVar5 = this->pushed_;
  if (iVar5 == 6) {
    dVar7 = (double)*(float *)&(this->super_Fl_Slider).super_Fl_Valuator.field_0xa4;
    iVar3 = (int)(((dVar1 - dVar6) * dVar7) / (1.0 - dVar7));
    if (dVar6 <= dVar1) {
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
    }
    else if (iVar4 < iVar3) {
      iVar3 = iVar4;
    }
  }
  else if (iVar5 == 5) {
    dVar7 = (double)*(float *)&(this->super_Fl_Slider).super_Fl_Valuator.field_0xa4;
    iVar5 = (int)(((dVar1 - dVar6) * dVar7) / (1.0 - dVar7));
    iVar3 = -iVar5;
    if (dVar6 <= dVar1) {
      if (iVar5 < iVar2) {
        iVar3 = iVar4;
      }
    }
    else if (iVar4 < iVar5) {
      iVar3 = iVar2;
    }
  }
  else if (iVar5 == 1) {
    iVar3 = -iVar3;
  }
  dVar6 = Fl_Valuator::clamp((Fl_Valuator *)this,
                             (double)((int)(this->super_Fl_Slider).super_Fl_Valuator.value_ + iVar3)
                            );
  Fl_Valuator::handle_drag((Fl_Valuator *)this,dVar6);
  return;
}

Assistant:

void Fl_Scrollbar::increment_cb() {
  char inv = maximum()<minimum();
  int ls = inv ? -linesize_ : linesize_;
  int i;
  switch (pushed_) {
    case 1: // clicked on arrow left
      i = -ls;
      break;
    default: // clicked on arrow right
      i =  ls;
      break;
    case 5: // clicked into the box next to the slider on the left
      i = -(int((maximum()-minimum())*slider_size()/(1.0-slider_size())));
      if (inv) {
        if (i<-ls) i = -ls;
      } else {
        if (i>-ls) i = -ls; // err
      }
      break;
    case 6: // clicked into the box next to the slider on the right
      i = (int((maximum()-minimum())*slider_size()/(1.0-slider_size())));
      if (inv) {
        if (i>ls) i = ls;
      } else {
        if (i<ls) i = ls; // err
      }
      break;
  }
  handle_drag(clamp(value() + i));
}